

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O3

void Bbr_bddImageTreeDelete2(Bbr_ImageTree2_t *pTree)

{
  if (pTree->bRel != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pTree->dd,pTree->bRel);
  }
  if (pTree->bCube != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pTree->dd,pTree->bCube);
  }
  if (pTree->bImage != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pTree->dd,pTree->bImage);
  }
  free(pTree);
  return;
}

Assistant:

void Bbr_bddImageTreeDelete2( Bbr_ImageTree2_t * pTree )
{
    if ( pTree->bRel )
        Cudd_RecursiveDeref( pTree->dd, pTree->bRel );
    if ( pTree->bCube )
        Cudd_RecursiveDeref( pTree->dd, pTree->bCube );
    if ( pTree->bImage )
        Cudd_RecursiveDeref( pTree->dd, pTree->bImage );
    ABC_FREE( pTree );
}